

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void ghc::filesystem::permissions(path *p,perms prms,perm_options opts,error_code *ec)

{
  EnableBitmask<ghc::filesystem::perm_options> EVar1;
  EnableBitmask<ghc::filesystem::perm_options> EVar2;
  EnableBitmask<ghc::filesystem::perm_options> EVar3;
  perms pVar4;
  perms X;
  EnableBitmask<ghc::filesystem::perms> Y;
  int iVar5;
  value_type *__file;
  undefined8 *in_RCX;
  perm_options in_DX;
  EnableBitmask<ghc::filesystem::perms> in_SI;
  error_code eVar6;
  file_status fs;
  undefined2 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb2;
  EnableBitmask<ghc::filesystem::perm_options> in_stack_ffffffffffffffb4;
  undefined2 in_stack_ffffffffffffffb6;
  undefined4 uStack_3c;
  file_status local_30;
  undefined4 uStack_24;
  undefined8 *local_18;
  perm_options local_c;
  EnableBitmask<ghc::filesystem::perms> local_a;
  
  local_18 = in_RCX;
  local_c = in_DX;
  local_a = in_SI;
  EVar1 = operator|(replace,add);
  EVar2 = operator|(EVar1,remove);
  EVar3 = operator&(in_DX,EVar2);
  if (EVar3 == 0) {
    eVar6 = detail::make_error_code(CONCAT22(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb4));
    *local_18 = CONCAT44(uStack_24,eVar6._M_value);
    local_18[1] = eVar6._M_cat;
  }
  else {
    symlink_status((path *)CONCAT26(EVar1,CONCAT24(in_DX,CONCAT22(EVar2,EVar3))),
                   (error_code *)
                   CONCAT26(in_stack_ffffffffffffffb6,
                            CONCAT24(in_stack_ffffffffffffffb4,
                                     CONCAT22(in_stack_ffffffffffffffb2,in_stack_ffffffffffffffb0)))
                  );
    EVar1 = operator&(local_c,replace);
    if (EVar1 != replace) {
      pVar4 = others_exec;
      in_stack_ffffffffffffffb4 = operator&(local_c,add);
      if (in_stack_ffffffffffffffb4 == add) {
        pVar4 = file_status::permissions(&local_30);
        local_a = operator|(pVar4,local_a);
      }
      else {
        X = file_status::permissions(&local_30);
        Y = operator~((filesystem *)(ulong)local_a,pVar4);
        local_a = operator&(X,Y);
      }
    }
    EVar2 = operator&(local_c,nofollow);
    if (EVar2 != nofollow) {
      __file = path::c_str((path *)0x28ff65);
      iVar5 = chmod(__file,(uint)local_a);
      if (iVar5 != 0) {
        eVar6 = detail::make_system_error(CONCAT22(EVar1,in_stack_ffffffffffffffb4));
        *local_18 = CONCAT44(uStack_3c,eVar6._M_value);
        local_18[1] = eVar6._M_cat;
      }
    }
    file_status::~file_status(&local_30);
  }
  return;
}

Assistant:

GHC_INLINE void permissions(const path& p, perms prms, perm_options opts, std::error_code& ec) noexcept
{
    if (static_cast<int>(opts & (perm_options::replace | perm_options::add | perm_options::remove)) == 0) {
        ec = detail::make_error_code(detail::portable_error::invalid_argument);
        return;
    }
    auto fs = symlink_status(p, ec);
    if ((opts & perm_options::replace) != perm_options::replace) {
        if ((opts & perm_options::add) == perm_options::add) {
            prms = fs.permissions() | prms;
        }
        else {
            prms = fs.permissions() & ~prms;
        }
    }
#ifdef GHC_OS_WINDOWS
#ifdef __GNUC__
    auto oldAttr = GetFileAttributesW(GHC_NATIVEWP(p));
    if (oldAttr != INVALID_FILE_ATTRIBUTES) {
        DWORD newAttr = ((prms & perms::owner_write) == perms::owner_write) ? oldAttr & ~(static_cast<DWORD>(FILE_ATTRIBUTE_READONLY)) : oldAttr | FILE_ATTRIBUTE_READONLY;
        if (oldAttr == newAttr || SetFileAttributesW(GHC_NATIVEWP(p), newAttr)) {
            return;
        }
    }
    ec = detail::make_system_error();
#else
    int mode = 0;
    if ((prms & perms::owner_read) == perms::owner_read) {
        mode |= _S_IREAD;
    }
    if ((prms & perms::owner_write) == perms::owner_write) {
        mode |= _S_IWRITE;
    }
    if (::_wchmod(p.wstring().c_str(), mode) != 0) {
        ec = detail::make_system_error();
    }
#endif
#else
    if ((opts & perm_options::nofollow) != perm_options::nofollow) {
        if (::chmod(p.c_str(), static_cast<mode_t>(prms)) != 0) {
            ec = detail::make_system_error();
        }
    }
#endif
}